

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffgiet(fitsfile *fptr,int *imgtype,int *status)

{
  int *in_RDX;
  int *in_RSI;
  int *in_RDI;
  int *unaff_retaddr;
  int *in_stack_00000008;
  double max_val;
  double min_val;
  double bzero;
  double bscale;
  long lngzero;
  long lngscale;
  int tstatus;
  int *in_stack_000000a0;
  fitsfile *in_stack_000000a8;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  double local_58;
  int *in_stack_ffffffffffffffb0;
  double dVar1;
  char *in_stack_ffffffffffffffb8;
  void *in_stack_ffffffffffffffc0;
  char *keyname;
  undefined8 in_stack_ffffffffffffffd0;
  int iVar2;
  uint in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar3;
  
  iVar2 = (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  keyname = (char *)0x0;
  if (0 < *in_RDX) {
    return *in_RDX;
  }
  if (*in_RDI == *(int *)(*(long *)(in_RDI + 2) + 0x54)) {
    if ((*(long *)(*(long *)(in_RDI + 2) + 0x88) == -1) &&
       (iVar3 = ffrdef(in_stack_000000a8,in_stack_000000a0), 0 < iVar3)) {
      return *in_RDX;
    }
  }
  else {
    ffmahd((fitsfile *)min_val,max_val._4_4_,in_stack_00000008,unaff_retaddr);
  }
  ffmaky((fitsfile *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
         in_stack_ffffffffffffff9c,(int *)0x175aa9);
  if (*(int *)(*(long *)(in_RDI + 2) + 0x58) == 0) {
    ffgky((fitsfile *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),iVar2,keyname,
          in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  }
  else {
    if (*(int *)(*(long *)(in_RDI + 2) + 0x47c) == 0) {
      *in_RDX = 0xe9;
      return *in_RDX;
    }
    ffgky((fitsfile *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),iVar2,keyname,
          in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  }
  iVar3 = 0;
  ffgky((fitsfile *)(ulong)in_stack_ffffffffffffffd8,iVar2,keyname,in_stack_ffffffffffffffc0,
        in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  if (iVar3 != 0) {
    in_stack_ffffffffffffffc0 = (void *)0x3ff0000000000000;
  }
  iVar3 = 0;
  ffgky((fitsfile *)(ulong)in_stack_ffffffffffffffd8,iVar2,keyname,in_stack_ffffffffffffffc0,
        in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  if (iVar3 != 0) {
    in_stack_ffffffffffffffb8 = (char *)0x0;
  }
  if (((((double)in_stack_ffffffffffffffc0 == 1.0) && (!NAN((double)in_stack_ffffffffffffffc0))) &&
      ((double)in_stack_ffffffffffffffb8 == 0.0)) && (!NAN((double)in_stack_ffffffffffffffb8))) {
    return *in_RDX;
  }
  iVar2 = *in_RSI;
  if (iVar2 == 8) {
    dVar1 = 0.0;
    local_58 = 255.0;
  }
  else if (iVar2 == 0x10) {
    dVar1 = -32768.0;
    local_58 = 32767.0;
  }
  else {
    if (iVar2 != 0x20) {
      return *in_RDX;
    }
    dVar1 = -2147483648.0;
    local_58 = 2147483647.0;
  }
  if ((double)in_stack_ffffffffffffffc0 < 0.0) {
    local_58 = (double)in_stack_ffffffffffffffc0 * dVar1 + (double)in_stack_ffffffffffffffb8;
    dVar1 = local_58;
  }
  else {
    local_58 = (double)in_stack_ffffffffffffffc0 * local_58 + (double)in_stack_ffffffffffffffb8;
  }
  dVar1 = (double)in_stack_ffffffffffffffc0 * dVar1 + (double)in_stack_ffffffffffffffb8;
  if ((double)in_stack_ffffffffffffffb8 < 2147483648.0) {
    keyname = (char *)(long)(double)in_stack_ffffffffffffffb8;
  }
  if (((double)in_stack_ffffffffffffffb8 != 2147483648.0) ||
     (NAN((double)in_stack_ffffffffffffffb8))) {
    if (((double)(long)keyname == (double)in_stack_ffffffffffffffb8) &&
       (!NAN((double)(long)keyname) && !NAN((double)in_stack_ffffffffffffffb8))) {
      if (((double)(long)(double)in_stack_ffffffffffffffc0 == (double)in_stack_ffffffffffffffc0) &&
         (!NAN((double)(long)(double)in_stack_ffffffffffffffc0) &&
          !NAN((double)in_stack_ffffffffffffffc0))) goto LAB_00175d9e;
    }
    if ((*in_RSI == 8) || (*in_RSI == 0x10)) {
      *in_RSI = -0x20;
    }
    else {
      *in_RSI = -0x40;
    }
  }
  else {
LAB_00175d9e:
    if ((((dVar1 != -128.0) || (NAN(dVar1))) || (local_58 != 127.0)) || (NAN(local_58))) {
      if ((dVar1 < -32768.0) || (32767.0 < local_58)) {
        if ((dVar1 < 0.0) || (65535.0 < local_58)) {
          if ((dVar1 < -2147483648.0) || (2147483647.0 < local_58)) {
            if ((dVar1 < 0.0) || (4294967296.0 <= local_58)) {
              *in_RSI = -0x40;
            }
            else {
              *in_RSI = 0x28;
            }
          }
          else {
            *in_RSI = 0x20;
          }
        }
        else {
          *in_RSI = 0x14;
        }
      }
      else {
        *in_RSI = 0x10;
      }
    }
    else {
      *in_RSI = 10;
    }
  }
  return *in_RDX;
}

Assistant:

int ffgiet( fitsfile *fptr,  /* I - FITS file pointer                       */
            int  *imgtype,   /* O - image data type                         */
            int  *status)    /* IO - error status                           */
/*
  Get the effective datatype of the image (= BITPIX keyword for normal image,
  or ZBITPIX for a compressed image)
*/
{
    int tstatus;
    long lngscale, lngzero = 0;
    double bscale, bzero, min_val, max_val;

    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               /* rescan header */
            return(*status);

    /* reset to beginning of header */
    ffmaky(fptr, 2, status);  /* simply move to beginning of header */

    if ((fptr->Fptr)->hdutype == IMAGE_HDU)
    {
        ffgky(fptr, TINT, "BITPIX", imgtype, NULL, status);
    }
    else if ((fptr->Fptr)->compressimg)
    {
        /* this is a binary table containing a compressed image */
        ffgky(fptr, TINT, "ZBITPIX", imgtype, NULL, status);
    }
    else
    {
        *status = NOT_IMAGE;
        return(*status);

    }

    /* check if the BSCALE and BZERO keywords are defined, which might
       change the effective datatype of the image  */
    tstatus = 0;
    ffgky(fptr, TDOUBLE, "BSCALE", &bscale, NULL, &tstatus);
    if (tstatus)
           bscale = 1.0;

    tstatus = 0;
    ffgky(fptr, TDOUBLE, "BZERO", &bzero, NULL, &tstatus);
    if (tstatus)
           bzero = 0.0;

    if (bscale == 1.0 && bzero == 0.0)  /* no scaling */
        return(*status);

    switch (*imgtype)
    {
      case BYTE_IMG:   /* 8-bit image */
        min_val = 0.;
        max_val = 255.0;
        break;

      case SHORT_IMG:
        min_val = -32768.0;
        max_val =  32767.0;
        break;
        
      case LONG_IMG:

        min_val = -2147483648.0;
        max_val =  2147483647.0;
        break;
        
      default:  /* don't have to deal with other data types */
        return(*status);
    }

    if (bscale >= 0.) {
        min_val = bzero + bscale * min_val;
        max_val = bzero + bscale * max_val;
    } else {
        max_val = bzero + bscale * min_val;
        min_val = bzero + bscale * max_val;
    }
    if (bzero < 2147483648.)  /* don't exceed range of 32-bit integer */
       lngzero = (long) bzero;
    lngscale = (long) bscale;

    if ((bzero != 2147483648.) && /* special value that exceeds integer range */
       (lngzero != bzero || lngscale != bscale)) { /* not integers? */
       /* floating point scaled values; just decide on required precision */
       if (*imgtype == BYTE_IMG || *imgtype == SHORT_IMG)
          *imgtype = FLOAT_IMG;
       else
         *imgtype = DOUBLE_IMG;

    /*
       In all the remaining cases, BSCALE and BZERO are integers,
       and not equal to 1 and 0, respectively.  
    */

    } else if ((min_val == -128.) && (max_val == 127.)) {
       *imgtype = SBYTE_IMG;

    } else if ((min_val >= -32768.0) && (max_val <= 32767.0)) {
       *imgtype = SHORT_IMG;

    } else if ((min_val >= 0.0) && (max_val <= 65535.0)) {
       *imgtype = USHORT_IMG;

    } else if ((min_val >= -2147483648.0) && (max_val <= 2147483647.0)) {
       *imgtype = LONG_IMG;

    } else if ((min_val >= 0.0) && (max_val < 4294967296.0)) {
       *imgtype = ULONG_IMG;

    } else {  /* exceeds the range of a 32-bit integer */
       *imgtype = DOUBLE_IMG;
    }   

    return(*status);
}